

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O1

size_t __thiscall proto2_unittest::TestNestedMessageEnum::ByteSizeLong(TestNestedMessageEnum *this)

{
  RepeatedField<int> *this_00;
  long lVar1;
  int iVar2;
  anon_union_40_1_493b367e_for_TestNestedMessageEnum_3 aVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  
  this_00 = &(this->field_0)._impl_.direct_enum_;
  sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(this_00);
  uVar4 = google::protobuf::internal::SooRep::size
                    (&this_00->soo_rep_,
                     (undefined1  [40])((undefined1  [40])this->field_0 & (undefined1  [40])0x4) ==
                     (undefined1  [40])0x0);
  sVar5 = uVar4 + sVar5;
  aVar3 = this->field_0;
  if (((undefined1  [40])aVar3 & (undefined1  [40])0x3) != (undefined1  [40])0x0) {
    if (((undefined1  [40])aVar3 & (undefined1  [40])0x1) != (undefined1  [40])0x0) {
      lVar1 = *(long *)(((ulong)(this->field_0)._impl_.redacted_string_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar1 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [40])aVar3 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
      sVar6 = TestMessageEnum::ByteSizeLong((this->field_0)._impl_.nested_enum_);
      uVar4 = (uint)sVar6 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t TestNestedMessageEnum::ByteSizeLong() const {
  const TestNestedMessageEnum& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestNestedMessageEnum)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.MetaAnnotatedEnum direct_enum = 1;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_direct_enum());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_direct_enum_size());
      total_size += data_size + tag_size;
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // string redacted_string = 3 [debug_redact = true];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_redacted_string());
    }
    // .proto2_unittest.TestMessageEnum nested_enum = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.nested_enum_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}